

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

void BinarySource_get_rsa_ssh1_pub(BinarySource *src,RSAKey *rsa,RsaSsh1Order order)

{
  unsigned_long uVar1;
  size_t sVar2;
  mp_int *local_30;
  mp_int *m;
  mp_int *e;
  uint bits;
  RsaSsh1Order order_local;
  RSAKey *rsa_local;
  BinarySource *src_local;
  
  uVar1 = BinarySource_get_uint32(src->binarysource_);
  if (order == RSA_SSH1_EXPONENT_FIRST) {
    m = BinarySource_get_mp_ssh1(src->binarysource_);
    local_30 = BinarySource_get_mp_ssh1(src->binarysource_);
  }
  else {
    local_30 = BinarySource_get_mp_ssh1(src->binarysource_);
    m = BinarySource_get_mp_ssh1(src->binarysource_);
  }
  if (rsa == (RSAKey *)0x0) {
    mp_free(m);
    mp_free(local_30);
  }
  else {
    rsa->bits = (int)uVar1;
    rsa->exponent = m;
    rsa->modulus = local_30;
    sVar2 = mp_get_nbits(local_30);
    rsa->bytes = (int)(sVar2 + 7 >> 3);
  }
  return;
}

Assistant:

void BinarySource_get_rsa_ssh1_pub(
    BinarySource *src, RSAKey *rsa, RsaSsh1Order order)
{
    unsigned bits;
    mp_int *e, *m;

    bits = get_uint32(src);
    if (order == RSA_SSH1_EXPONENT_FIRST) {
        e = get_mp_ssh1(src);
        m = get_mp_ssh1(src);
    } else {
        m = get_mp_ssh1(src);
        e = get_mp_ssh1(src);
    }

    if (rsa) {
        rsa->bits = bits;
        rsa->exponent = e;
        rsa->modulus = m;
        rsa->bytes = (mp_get_nbits(m) + 7) / 8;
    } else {
        mp_free(e);
        mp_free(m);
    }
}